

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.h
# Opt level: O0

void __thiscall CVmDbgFrameSymPtr::inc(CVmDbgFrameSymPtr *this)

{
  int iVar1;
  uint uVar2;
  long *in_RDI;
  
  iVar1 = is_sym_inline((CVmDbgFrameSymPtr *)0x2f6e08);
  if (iVar1 == 0) {
    *in_RDI = *in_RDI + 4;
  }
  else {
    uVar2 = get_sym_len((CVmDbgFrameSymPtr *)0x2f6e17);
    *in_RDI = *in_RDI + (ulong)(uVar2 + 2);
  }
  *in_RDI = G_dbg_lclsym_hdr_size_X + *in_RDI;
  return;
}

Assistant:

void inc(VMG0_)
    {
        /* skip the in-line symbol, or the pointer */
        if (is_sym_inline())
            p_ += get_sym_len(vmg0_) + 2;
        else
            p_ += 4;

        /* skip the header */
        p_ += G_dbg_lclsym_hdr_size;
    }